

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QString * __thiscall QCommandLineParser::errorText(QCommandLineParser *this)

{
  bool bVar1;
  qsizetype qVar2;
  QString *pQVar3;
  QArrayDataPointer<char16_t> *this_00;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QList<QString> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  QString *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar5;
  QString *this_01;
  long *plVar6;
  QChar fillChar;
  QChar local_8a;
  QArrayDataPointer<char16_t> local_88 [4];
  QChar local_22;
  char local_20 [24];
  long local_8;
  int iVar4;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  plVar6 = in_RSI;
  bVar1 = QString::isEmpty((QString *)0x6f10f5);
  fillChar.ucs = (char16_t)((ulong)plVar6 >> 0x30);
  if (bVar1) {
    qVar2 = QList<QString>::size((QList<QString> *)(*in_RSI + 0x70));
    if (qVar2 == 1) {
      uVar5 = 0;
      tr(local_20,(char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      pQVar3 = QList<QString>::constFirst(in_stack_ffffffffffffff00);
      iVar4 = (int)((ulong)pQVar3 >> 0x20);
      QChar::QChar<char16_t,_true>(&local_22,L' ');
      QString::arg<QString,_true>
                (this_01,(QString *)CONCAT44(uVar5,in_stack_ffffffffffffff18),iVar4,fillChar);
      QString::~QString((QString *)0x6f11a9);
    }
    else {
      qVar2 = QList<QString>::size((QList<QString> *)(*in_RSI + 0x70));
      if (qVar2 < 2) {
        QString::QString((QString *)0x6f136f);
      }
      else {
        tr(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        this_00 = (QArrayDataPointer<char16_t> *)(*in_RSI + 0x70);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_88,(Data *)0x0,L", ",2);
        QString::QString((QString *)this_00,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QListSpecialMethods<QString>::join
                  ((QListSpecialMethods<QString> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10);
        iVar4 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
        QChar::QChar<char16_t,_true>(&local_8a,L' ');
        QString::arg<QString,_true>
                  (this_01,(QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   iVar4,fillChar);
        QString::~QString((QString *)0x6f12cc);
        QString::~QString((QString *)0x6f12d9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
        QString::~QString((QString *)0x6f12f3);
      }
    }
  }
  else {
    QString::QString((QString *)in_stack_ffffffffffffff00,
                     (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::errorText() const
{
    if (!d->errorText.isEmpty())
        return d->errorText;
    if (d->unknownOptionNames.size() == 1)
        return tr("Unknown option '%1'.").arg(d->unknownOptionNames.constFirst());
    if (d->unknownOptionNames.size() > 1)
        return tr("Unknown options: %1.").arg(d->unknownOptionNames.join(QStringLiteral(", ")));
    return QString();
}